

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microui.c
# Opt level: O1

int mu_pool_init(mu_Context *ctx,mu_PoolItem *items,int len,mu_Id id)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  int extraout_EDX;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar1 = ctx->frame;
  uVar4 = (ulong)uVar1;
  if (len < 1) {
    uVar3 = 0xffffffff;
  }
  else {
    uVar3 = 0xffffffff;
    uVar5 = 0;
    uVar6 = uVar4;
    do {
      if (items[uVar5].last_update < (int)uVar6) {
        uVar3 = uVar5 & 0xffffffff;
        uVar6 = (ulong)(uint)items[uVar5].last_update;
      }
      uVar5 = uVar5 + 1;
    } while ((uint)len != uVar5);
  }
  if (-1 < (int)uVar3) {
    items[uVar3].id = id;
    items[uVar3].last_update = uVar1;
    return (int)uVar3;
  }
  mu_pool_init_cold_1();
  iVar2 = *(int *)(uVar4 + 0xa4);
  items[extraout_EDX].last_update = iVar2;
  return iVar2;
}

Assistant:

int mu_pool_init(mu_Context *ctx, mu_PoolItem *items, int len, mu_Id id) {
  int i, n = -1, f = ctx->frame;
  for (i = 0; i < len; i++) {
    if (items[i].last_update < f) {
      f = items[i].last_update;
      n = i;
    }
  }
  expect(n > -1);
  items[n].id = id;
  mu_pool_update(ctx, items, n);
  return n;
}